

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaReleaseLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  Type *pTVar3;
  int iVar4;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  iVar4 = this->current_size_;
  if (iVar4 < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    other = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
    iVar4 = this->current_size_;
  }
  pRVar2 = this->rep_;
  this->current_size_ = iVar4 + -1;
  pTVar3 = (Type *)pRVar2->elements[(long)iVar4 + -1];
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  if (iVar4 < iVar1) {
    pRVar2->elements[(long)iVar4 + -1] = pRVar2->elements[(long)iVar1 + -1];
  }
  return pTVar3;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::UnsafeArenaReleaseLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  typename TypeHandler::Type* result =
      cast<TypeHandler>(rep_->elements[--current_size_]);
  --rep_->allocated_size;
  if (current_size_ < rep_->allocated_size) {
    // There are cleared elements on the end; replace the removed element
    // with the last allocated element.
    rep_->elements[current_size_] = rep_->elements[rep_->allocated_size];
  }
  return result;
}